

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O3

void __thiscall iu_Matcher_x_iutest_x_Pair_Test::Body(iu_Matcher_x_iutest_x_Pair_Test *this)

{
  AssertionResult *in_R8;
  AssertionResult iutest_ar;
  detail *local_3b0;
  long local_3a0 [2];
  string local_390;
  AssertionResult local_370;
  AssertionHelper local_348;
  undefined1 local_318 [16];
  undefined **local_308;
  undefined1 *local_300;
  undefined4 local_2f8;
  ios_base local_298 [264];
  undefined1 local_190 [392];
  
  local_300 = local_190;
  local_190._0_4_ = 10;
  local_318._0_8_ = &PTR__EachMatcher_0023e598;
  local_318._8_8_ = &PTR__PairMatcher_0023e558;
  local_308 = &PTR__IMatcher_0023c7c0;
  local_2f8 = 100;
  iutest::detail::EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,int>>::
  operator()(&local_370,
             (EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,int>> *)
             local_318,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             (anonymous_namespace)::gm);
  if (local_370.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_318);
    iutest::detail::
    DefaultPrintTo<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
              (0,(anonymous_namespace)::gm,&local_308);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
    std::ios_base::~ios_base(local_298);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_390,local_3b0,"Each(Pair(Le(10), 100))",(char *)&local_370,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_390._M_dataplus._M_p,(allocator<char> *)local_318);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0x161;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_190,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if (local_3b0 != (detail *)local_3a0) {
      operator_delete(local_3b0,local_3a0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(Matcher, Pair)
{
    IUTEST_EXPECT_THAT(gm, Each(Pair(Le(10), 100)));
}